

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManCounterExampleValueStart(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  
  iVar11 = pAig->nRegs;
  if (iVar11 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x532,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  if (pAig->pData2 != (void *)0x0) {
    __assert_fail("pAig->pData2 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x533,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  uVar5 = (pCex->iFrame + 1) * pAig->vObjs->nSize;
  pvVar6 = calloc((long)(int)((((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0)),4);
  pAig->pData2 = pvVar6;
  for (uVar5 = 0; (int)uVar5 < iVar11; uVar5 = uVar5 + 1) {
    Vec_PtrEntry(pAig->vCis,pAig->nTruePis + uVar5);
    if (((uint)(&pCex[1].iPo)[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
      __assert_fail("Abc_InfoHasBit(pCex->pData, iBit++) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x538,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
    }
    iVar11 = pAig->nRegs;
  }
  iVar11 = pAig->vObjs->nSize;
  iVar4 = 0;
  while (iVar12 = pCex->iFrame, iVar4 <= iVar12) {
    iVar12 = iVar4 * iVar11;
    puVar1 = (uint *)((long)pAig->pData2 + (long)(iVar12 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)iVar12 & 0x1f);
    for (iVar13 = 0; uVar10 = iVar13 + uVar5, iVar13 < pAig->nTruePis; iVar13 = iVar13 + 1) {
      pvVar6 = Vec_PtrEntry(pAig->vCis,iVar13);
      if (((uint)(&pCex[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) {
        iVar8 = *(int *)((long)pvVar6 + 0x24) + iVar12;
        puVar1 = (uint *)((long)pAig->pData2 + (long)(iVar8 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)iVar8 & 0x1f);
      }
    }
    iVar13 = 0;
    while( true ) {
      iVar8 = -1;
      if (pAig->vObjs->nSize <= iVar13) break;
      pvVar6 = Vec_PtrEntry(pAig->vObjs,iVar13);
      if ((pvVar6 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7)) {
        uVar2 = *(ulong *)((long)pvVar6 + 8);
        iVar9 = iVar8;
        if (uVar2 != 0) {
          iVar9 = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x24);
        }
        pvVar7 = pAig->pData2;
        uVar3 = *(ulong *)((long)pvVar6 + 0x10);
        if (uVar3 != 0) {
          iVar8 = *(int *)((uVar3 & 0xfffffffffffffffe) + 0x24);
        }
        if ((((uint)uVar3 ^
             *(uint *)((long)pvVar7 + (long)(iVar8 + iVar12 >> 5) * 4) >>
             ((byte)(iVar8 + iVar12) & 0x1f)) &
             (*(uint *)((long)pvVar7 + (long)(iVar9 + iVar12 >> 5) * 4) >>
              ((byte)(iVar9 + iVar12) & 0x1f) ^ (uint)uVar2) & 1) != 0) {
          iVar8 = *(int *)((long)pvVar6 + 0x24) + iVar12;
          puVar1 = (uint *)((long)pvVar7 + (long)(iVar8 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)iVar8 & 0x1f);
        }
      }
      iVar13 = iVar13 + 1;
    }
    for (iVar13 = 0; iVar13 < pAig->vCos->nSize; iVar13 = iVar13 + 1) {
      pvVar6 = Vec_PtrEntry(pAig->vCos,iVar13);
      uVar2 = *(ulong *)((long)pvVar6 + 8);
      iVar9 = iVar8;
      if (uVar2 != 0) {
        iVar9 = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x24);
      }
      if ((((uint)uVar2 ^
           *(uint *)((long)pAig->pData2 + (long)(iVar9 + iVar12 >> 5) * 4) >>
           ((byte)(iVar9 + iVar12) & 0x1f)) & 1) != 0) {
        iVar9 = *(int *)((long)pvVar6 + 0x24) + iVar12;
        puVar1 = (uint *)((long)pAig->pData2 + (long)(iVar9 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)iVar9 & 0x1f);
      }
    }
    iVar13 = iVar4 + 1;
    bVar14 = iVar4 != pCex->iFrame;
    uVar5 = uVar10;
    iVar4 = iVar13;
    if (bVar14) {
      for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
        pvVar6 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
        pvVar7 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar8);
        uVar10 = *(int *)((long)pvVar6 + 0x24) + iVar12;
        if ((*(uint *)((long)pAig->pData2 + (long)((int)uVar10 >> 5) * 4) >> (uVar10 & 0x1f) & 1) !=
            0) {
          iVar9 = *(int *)((long)pvVar7 + 0x24) + iVar13 * iVar11;
          puVar1 = (uint *)((long)pAig->pData2 + (long)(iVar9 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)iVar9 & 0x1f);
        }
      }
    }
  }
  if (uVar5 == pCex->nBits) {
    pvVar6 = pAig->pData2;
    pvVar7 = Vec_PtrEntry(pAig->vCos,pCex->iPo);
    uVar5 = iVar12 * iVar11 + *(int *)((long)pvVar7 + 0x24);
    if ((*(uint *)((long)pvVar6 + (long)((int)uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1) == 0) {
      __assert_fail("Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) )"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x55b,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
    }
    return;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                ,0x559,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
}

Assistant:

void Aig_ManCounterExampleValueStart( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int Val0, Val1, nObjs, i, k, iBit = 0;
    assert( Aig_ManRegNum(pAig) > 0 ); // makes sense only for sequential AIGs
    assert( pAig->pData2 == NULL );    // if this fail, there may be a memory leak
    // allocate memory to store simulation bits for internal nodes
    pAig->pData2 = ABC_CALLOC( unsigned, Abc_BitWordNum( (pCex->iFrame + 1) * Aig_ManObjNumMax(pAig) ) );
    // the register values in the counter-example should be zero
    Saig_ManForEachLo( pAig, pObj, k )
        assert( Abc_InfoHasBit(pCex->pData, iBit++) == 0 );
    // iterate through the timeframes
    nObjs = Aig_ManObjNumMax(pAig);
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        // set constant 1 node
        Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + 0 );
        // set primary inputs according to the counter-example
        Saig_ManForEachPi( pAig, pObj, k )
            if ( Abc_InfoHasBit(pCex->pData, iBit++) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        // compute values for each node
        Aig_ManForEachNode( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            Val1 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId1(pObj) );
            if ( (Val0 ^ Aig_ObjFaninC0(pObj)) & (Val1 ^ Aig_ObjFaninC1(pObj)) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        // derive values for combinational outputs
        Aig_ManForEachCo( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            if ( Val0 ^ Aig_ObjFaninC0(pObj) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        if ( i == pCex->iFrame )
            continue;
        // transfer values to the register output of the next frame
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            if ( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObjRi) ) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * (i+1) + Aig_ObjId(pObjRo) );
    }
    assert( iBit == pCex->nBits );
    // check that the counter-example is correct, that is, the corresponding output is asserted
    assert( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) ) );
}